

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void prepare_warp_vertical_filter_avx2
               (uint8_t *pred,__m256i *horz_out,ConvolveParams *conv_params,int16_t gamma,
               int16_t delta,int p_height,int p_stride,int p_width,int i,int j,int sy4,
               int reduce_bits_vert,__m256i *res_add_const,int round_bits,__m256i *res_sub_const,
               __m256i *round_bits_const,__m256i *wt)

{
  short in_CX;
  short in_R8W;
  undefined4 in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  undefined4 in_stack_00000040;
  int in_stack_00000048;
  __m256i *in_stack_00000050;
  __m256i *in_stack_00000058;
  int in_stack_00000290;
  int16_t in_stack_00000294;
  int16_t in_stack_00000296;
  ConvolveParams *in_stack_00000298;
  __m256i *in_stack_000002a0;
  uint8_t *in_stack_000002a8;
  int in_stack_000002b0;
  int16_t in_stack_000002b4;
  int16_t in_stack_000002b6;
  ConvolveParams *in_stack_000002b8;
  __m256i *in_stack_000002c0;
  uint8_t *in_stack_000002c8;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  
  if ((in_CX == 0) && (in_R8W == 0)) {
    warp_vertical_filter_gamma0_delta0_avx2
              (in_stack_000002a8,in_stack_000002a0,in_stack_00000298,in_stack_00000296,
               in_stack_00000294,in_stack_00000290,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
               (__m256i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_00000040),in_stack_00000048,
               in_stack_00000050,in_stack_00000058,
               (__m256i *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else if ((in_CX == 0) && (in_R8W != 0)) {
    warp_vertical_filter_gamma0_avx2
              (in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,in_stack_000002b6,
               in_stack_000002b4,in_stack_000002b0,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
               (__m256i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_00000040),in_stack_00000048,
               in_stack_00000050,in_stack_00000058,
               (__m256i *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else if ((in_CX == 0) || (in_R8W != 0)) {
    warp_vertical_filter_avx2
              (in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,in_stack_000002b6,
               in_stack_000002b4,in_stack_000002b0,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
               (__m256i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_00000040),in_stack_00000048,
               in_stack_00000050,in_stack_00000058,
               (__m256i *)CONCAT44(in_stack_00000010,in_stack_00000008));
  }
  else {
    warp_vertical_filter_delta0_avx2
              (in_stack_000002a8,in_stack_000002a0,in_stack_00000298,in_stack_00000296,
               in_stack_00000294,in_stack_00000290,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
               (__m256i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_00000040),in_stack_00000048,
               in_stack_00000050,in_stack_00000058,
               (__m256i *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  return;
}

Assistant:

static inline void prepare_warp_vertical_filter_avx2(
    uint8_t *pred, __m256i *horz_out, ConvolveParams *conv_params,
    int16_t gamma, int16_t delta, int p_height, int p_stride, int p_width,
    int i, int j, int sy4, const int reduce_bits_vert,
    const __m256i *res_add_const, const int round_bits,
    const __m256i *res_sub_const, const __m256i *round_bits_const,
    const __m256i *wt) {
  if (gamma == 0 && delta == 0)
    warp_vertical_filter_gamma0_delta0_avx2(
        pred, horz_out, conv_params, gamma, delta, p_height, p_stride, p_width,
        i, j, sy4, reduce_bits_vert, res_add_const, round_bits, res_sub_const,
        round_bits_const, wt);
  else if (gamma == 0 && delta != 0)
    warp_vertical_filter_gamma0_avx2(
        pred, horz_out, conv_params, gamma, delta, p_height, p_stride, p_width,
        i, j, sy4, reduce_bits_vert, res_add_const, round_bits, res_sub_const,
        round_bits_const, wt);
  else if (gamma != 0 && delta == 0)
    warp_vertical_filter_delta0_avx2(
        pred, horz_out, conv_params, gamma, delta, p_height, p_stride, p_width,
        i, j, sy4, reduce_bits_vert, res_add_const, round_bits, res_sub_const,
        round_bits_const, wt);
  else
    warp_vertical_filter_avx2(pred, horz_out, conv_params, gamma, delta,
                              p_height, p_stride, p_width, i, j, sy4,
                              reduce_bits_vert, res_add_const, round_bits,
                              res_sub_const, round_bits_const, wt);
}